

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  st_ptls_ffx_test_variants_t *psVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ptls_cipher_context_t *ppVar6;
  X509 *pXVar7;
  X509_STORE *pXVar8;
  st_ptls_ffx_test_variants_t *psVar9;
  EVP_PKEY_CTX *ctx;
  stack_st_X509 *chain;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx_00;
  ENGINE *e;
  char *_name;
  ptls_hash_algorithm_t *algo;
  char *pcVar10;
  long lVar11;
  ptls_iovec_t key;
  ptls_ech_create_opener_t ech_create_opener;
  ptls_openssl_sign_certificate_t openssl_sign_certificate;
  ptls_iovec_t minicrypto_certificate;
  ptls_iovec_t cert;
  ptls_openssl_verify_certificate_t openssl_verify_certificate;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
  uint8_t actual [64];
  uint8_t encrypted [8];
  ptls_context_t openssl_ctx_sha256only;
  ptls_ech_create_opener_t local_488;
  ptls_openssl_sign_certificate_t local_480;
  ptls_iovec_t local_460;
  ptls_iovec_t local_450;
  ptls_openssl_verify_certificate_t local_440;
  ptls_minicrypto_secp256r1sha256_sign_certificate_t local_420;
  ptls_context_t local_3f8;
  ptls_context_t local_2b0;
  ptls_context_t local_170;
  
  local_488.cb = create_ech_opener;
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  uVar4 = OSSL_PROVIDER_load(0,"legacy");
  uVar5 = OSSL_PROVIDER_load(0,"default");
  enter_subtest("bf");
  ppVar6 = ptls_cipher_new(&ptls_openssl_bfecb,1,test_bf_key);
  (*ppVar6->do_transform)(ppVar6,&local_2b0,&test_bf_plaintext,8);
  ptls_cipher_free(ppVar6);
  _ok((uint)(local_2b0.random_bytes == (_func_void_void_ptr_size_t *)0x61d2144ce730c0e1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x72);
  ppVar6 = ptls_cipher_new(&ptls_openssl_bfecb,0,test_bf_key);
  (*ppVar6->do_transform)(ppVar6,&local_170,"deadbeef",8);
  (*ppVar6->do_transform)(ppVar6,&local_170,&local_2b0,8);
  ptls_cipher_free(ppVar6);
  _ok((uint)(local_170.random_bytes == (_func_void_void_ptr_size_t *)0x78dd98614597f94e),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x79);
  exit_subtest("bf");
  enter_subtest("key-exchange");
  enter_subtest("secp256r1-self");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-self");
  enter_subtest("secp256r1-to-minicrypto");
  test_key_exchange(&ptls_openssl_secp256r1,&ptls_minicrypto_secp256r1);
  exit_subtest("secp256r1-to-minicrypto");
  enter_subtest("secp256r1-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_secp256r1,&ptls_openssl_secp256r1);
  exit_subtest("secp256r1-from-minicrypto");
  enter_subtest("secp384r1");
  test_key_exchange(&ptls_openssl_secp384r1,&ptls_openssl_secp384r1);
  exit_subtest("secp384r1");
  enter_subtest("secp521r1");
  test_key_exchange(&ptls_openssl_secp521r1,&ptls_openssl_secp521r1);
  exit_subtest("secp521r1");
  enter_subtest("x25519-self");
  test_key_exchange(&ptls_openssl_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-self");
  enter_subtest("x25519-to-minicrypto");
  test_key_exchange(&ptls_openssl_x25519,&ptls_minicrypto_x25519);
  exit_subtest("x25519-to-minicrypto");
  enter_subtest("x25519-from-minicrypto");
  test_key_exchange(&ptls_minicrypto_x25519,&ptls_openssl_x25519);
  exit_subtest("x25519-from-minicrypto");
  pcVar10 = "key-exchange";
  exit_subtest("key-exchange");
  pXVar7 = (X509 *)x509_from_pem(pcVar10);
  local_450.base = (uint8_t *)0x0;
  iVar3 = i2d_X509(pXVar7,&local_450.base);
  local_450.len = (size_t)iVar3;
  X509_free(pXVar7);
  setup_sign_certificate(&local_480);
  pXVar8 = X509_STORE_new();
  X509_STORE_set_verify_cb(pXVar8,verify_cert_cb);
  ptls_openssl_init_verify_certificate(&local_440,(X509_STORE *)pXVar8);
  local_2b0.random_bytes = ptls_openssl_random_bytes;
  local_2b0.get_time = &ptls_get_time;
  local_2b0.key_exchanges = ptls_openssl_key_exchanges;
  local_2b0.cipher_suites = ptls_openssl_cipher_suites_all;
  local_2b0.certificates.count = 1;
  local_2b0.pre_shared_key.identity.base = (uint8_t *)0x0;
  local_2b0.pre_shared_key.identity.len = 0;
  local_2b0.pre_shared_key.secret.base = (uint8_t *)0x0;
  local_2b0.pre_shared_key.secret.len = 0;
  local_2b0.pre_shared_key.hash = (ptls_hash_algorithm_t *)0x0;
  local_2b0.ech.client.ciphers = ptls_openssl_hpke_cipher_suites;
  local_2b0.ech.client.kems = ptls_openssl_hpke_kems;
  local_2b0.ech.server.create_opener = &local_488;
  local_2b0.ech.server.retry_configs.base = "";
  local_2b0.ech.server.retry_configs.len = 0x65;
  local_2b0.on_client_hello = (ptls_on_client_hello_t *)0x0;
  local_2b0.emit_certificate = (ptls_emit_certificate_t *)0x0;
  local_2b0.verify_certificate = (ptls_verify_certificate_t *)0x0;
  local_2b0.ticket_lifetime = 0;
  local_2b0.max_early_data_size = 0;
  local_2b0.max_buffer_size = 0;
  local_2b0.hkdf_label_prefix__obsolete = (char *)0x0;
  local_2b0._184_1_ = 0;
  local_2b0.on_extension = (ptls_on_extension_t *)0x0;
  local_2b0.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  local_2b0.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
  local_2b0.log_event = (ptls_log_event_t *)0x0;
  local_2b0.update_open_count = (ptls_update_open_count_t *)0x0;
  local_2b0.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  local_2b0.save_ticket = (ptls_save_ticket_t *)0x0;
  local_2b0.tls12_cipher_suites = ptls_openssl_tls12_cipher_suites;
  local_2b0.ticket_context.bytes[0] = '\0';
  local_2b0.ticket_context.bytes[1] = '\0';
  local_2b0.ticket_context.bytes[2] = '\0';
  local_2b0.ticket_context.bytes[3] = '\0';
  local_2b0.ticket_context.bytes[4] = '\0';
  local_2b0.ticket_context.bytes[5] = '\0';
  local_2b0.ticket_context.bytes[6] = '\0';
  local_2b0.ticket_context.bytes[7] = '\0';
  local_2b0.ticket_context.bytes[8] = '\0';
  local_2b0.ticket_context.bytes[9] = '\0';
  local_2b0.ticket_context.bytes[10] = '\0';
  local_2b0.ticket_context.bytes[0xb] = '\0';
  local_2b0.ticket_context.bytes[0xc] = '\0';
  local_2b0.ticket_context.bytes[0xd] = '\0';
  local_2b0.ticket_context.bytes[0xe] = '\0';
  local_2b0.ticket_context.bytes[0xf] = '\0';
  local_2b0.ticket_context.bytes[0x10] = '\0';
  local_2b0.ticket_context.bytes[0x11] = '\0';
  local_2b0.ticket_context.bytes[0x12] = '\0';
  local_2b0.ticket_context.bytes[0x13] = '\0';
  local_2b0.ticket_context.bytes[0x14] = '\0';
  local_2b0.ticket_context.bytes[0x15] = '\0';
  local_2b0.ticket_context.bytes[0x16] = '\0';
  local_2b0.ticket_context.bytes[0x17] = '\0';
  local_2b0.ticket_context.bytes[0x18] = '\0';
  local_2b0.ticket_context.bytes[0x19] = '\0';
  local_2b0.ticket_context.bytes[0x1a] = '\0';
  local_2b0.ticket_context.bytes[0x1b] = '\0';
  local_2b0.ticket_context.bytes[0x1c] = '\0';
  local_2b0.ticket_context.bytes[0x1d] = '\0';
  local_2b0.ticket_context.bytes[0x1e] = '\0';
  local_2b0.ticket_context.bytes[0x1f] = '\0';
  local_2b0.ticket_context._32_4_ = 0;
  local_2b0.client_ca_names.list = (ptls_iovec_t *)0x0;
  local_2b0.client_ca_names.count._0_7_ = 0;
  local_2b0._311_4_ = 0;
  local_2b0.certificates.list = &local_450;
  local_2b0.sign_certificate = &local_480.super;
  memcpy(&local_170,&local_2b0,0x140);
  if ((*local_170.cipher_suites)->hash->digest_size != 0x20) {
    sVar1 = ptls_openssl_cipher_suites_all[0]->hash->digest_size;
    if ((sVar1 != 0x40) && (sVar1 != 0x30)) {
      __assert_fail("openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || openssl_ctx.cipher_suites[0]->hash->digest_size == 48"
                    ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                    0x23c,"int main(int, char **)");
    }
    do {
      local_170.cipher_suites = local_170.cipher_suites + 1;
    } while ((*local_170.cipher_suites)->hash->digest_size != 0x20);
  }
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  ::ctx = &local_2b0;
  ctx_peer = &local_2b0;
  verify_certificate = &local_440.super;
  psVar9->algo = &ptls_ffx_ptls_openssl_aes128ctr_b125_r8;
  psVar9->bit_length = 0x7d;
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar9->algo = &ptls_ffx_ptls_openssl_aes128ctr_b31_r6;
  psVar9->bit_length = 0x1f;
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar9->algo = &ptls_ffx_ptls_openssl_aes128ctr_b53_r4;
  psVar9->bit_length = 0x35;
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar9->algo = &ptls_ffx_ptls_openssl_chacha20_b256_r8;
  psVar9->bit_length = 0x100;
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar9->algo = &ptls_ffx_ptls_openssl_chacha20_b32_r6;
  psVar9->bit_length = 0x20;
  psVar2 = ffx_variants;
  do {
    psVar9 = psVar2;
    psVar2 = psVar9 + 1;
  } while (psVar9->algo != (ptls_cipher_algorithm_t *)0x0);
  psVar9->algo = &ptls_ffx_ptls_openssl_chacha20_b57_r4;
  psVar9->bit_length = 0x39;
  enter_subtest("sha");
  algo = &ptls_openssl_sha256;
  lVar11 = 0;
  do {
    note("%s",algo->name);
    iVar3 = ptls_calc_hash(algo,&local_3f8,
                           "Alice was beginning to get very tired of sitting by her sister on the bank, and of having nothing to do: once or twice she had peeped into the book her sister was reading, but it had no pictures or conversations in it, and where is the use of a book, thought Alice, without pictures or conversations?"
                           ,300);
    _ok((uint)(iVar3 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0xc2);
    iVar3 = bcmp(&local_3f8,test_sha_all + lVar11 + 8,algo->digest_size);
    _ok((uint)(iVar3 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
    algo = *(ptls_hash_algorithm_t **)(test_sha_all + lVar11 + 0x48);
    lVar11 = lVar11 + 0x48;
  } while (lVar11 != 0xd8);
  exit_subtest("sha");
  enter_subtest("rsa-sign");
  test_sign_verify((EVP_PKEY *)::ctx->sign_certificate[1].cb,
                   (ptls_openssl_signature_scheme_t *)::ctx->sign_certificate[2].cb);
  exit_subtest("rsa-sign");
  enter_subtest("ecdsa-sign");
  do_test_ecdsa_sign(0x19f,secp256r1_signature_schemes);
  do_test_ecdsa_sign(0x2cb,secp384r1_signature_schemes);
  do_test_ecdsa_sign(0x2cc,secp521r1_signature_schemes);
  exit_subtest("ecdsa-sign");
  enter_subtest("ed25519-sign");
  local_3f8.random_bytes = (_func_void_void_ptr_size_t *)0x0;
  ctx = EVP_PKEY_CTX_new_id(0x43f,(ENGINE *)0x0);
  EVP_PKEY_keygen_init(ctx);
  EVP_PKEY_keygen(ctx,(EVP_PKEY **)&local_3f8);
  EVP_PKEY_CTX_free(ctx);
  test_sign_verify((EVP_PKEY *)local_3f8.random_bytes,ed25519_signature_schemes);
  EVP_PKEY_free((EVP_PKEY *)local_3f8.random_bytes);
  exit_subtest("ed25519-sign");
  pcVar10 = "cert-verify";
  enter_subtest("cert-verify");
  pXVar7 = (X509 *)x509_from_pem(pcVar10);
  chain = (stack_st_X509 *)OPENSSL_sk_new_null();
  pXVar8 = X509_STORE_new();
  iVar3 = verify_cert_chain((X509_STORE *)pXVar8,(X509 *)pXVar7,chain,0,"test.example.com",
                            (int *)&local_3f8);
  _ok((uint)(iVar3 == 0x30),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x11a);
  m = X509_LOOKUP_file();
  ctx_00 = X509_STORE_add_lookup(pXVar8,m);
  iVar3 = X509_LOOKUP_ctrl(ctx_00,1,"t/assets/test-ca.crt",1,(char **)0x0);
  _ok(iVar3,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  iVar3 = verify_cert_chain((X509_STORE *)pXVar8,(X509 *)pXVar7,chain,0,"test.example.com",
                            (int *)&local_3f8);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  iVar3 = verify_cert_chain((X509_STORE *)pXVar8,(X509 *)pXVar7,chain,0,"test2.example.com",
                            (int *)&local_3f8);
  _ok((uint)(iVar3 == 0x2a),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c");
  X509_free(pXVar7);
  OPENSSL_sk_free(chain);
  X509_STORE_free(pXVar8);
  exit_subtest("cert-verify");
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = &local_170;
  ctx_peer = &local_170;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = &local_170;
  ctx_peer = &local_2b0;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  ::ctx = &local_2b0;
  ctx_peer = &local_170;
  enter_subtest("picotls");
  test_picotls();
  exit_subtest("picotls");
  local_460.base = (uint8_t *)anon_var_dwarf_39a39;
  local_460.len = 0x264;
  key.len = 0x20;
  key.base = (uint8_t *)anon_var_dwarf_39a51;
  ptls_minicrypto_init_secp256r1sha256_sign_certificate(&local_420,key);
  memset(&local_3f8.pre_shared_key,0,0x110);
  local_3f8.random_bytes = ptls_minicrypto_random_bytes;
  local_3f8.get_time = &ptls_get_time;
  local_3f8.key_exchanges = ptls_minicrypto_key_exchanges;
  local_3f8.cipher_suites = ptls_minicrypto_cipher_suites;
  local_3f8.certificates.count = 1;
  ::ctx = &local_2b0;
  ctx_peer = &local_3f8;
  local_3f8.certificates.list = &local_460;
  local_3f8.sign_certificate = &local_420.super;
  enter_subtest("vs. minicrypto");
  test_picotls();
  exit_subtest("vs. minicrypto");
  ::ctx = &local_3f8;
  ctx_peer = &local_2b0;
  enter_subtest("minicrypto vs.");
  test_picotls();
  exit_subtest("minicrypto vs.");
  enter_subtest("hpke");
  test_hpke(ptls_openssl_hpke_kems,ptls_openssl_hpke_cipher_suites);
  exit_subtest("hpke");
  local_2b0.key_exchanges = main::fast_keyex;
  local_2b0.cipher_suites = main::fast_cipher;
  local_480._24_1_ = local_480._24_1_ & 0xfe;
  ::ctx = &local_2b0;
  ctx_peer = &local_2b0;
  enter_subtest("many-handshakes-non-async");
  many_handshakes();
  exit_subtest("many-handshakes-non-async");
  local_480._24_1_ = local_480._24_1_ & 0xfe;
  enter_subtest("many-handshakes-async");
  many_handshakes();
  exit_subtest("many-handshakes-async");
  e = ENGINE_by_id("qatengine");
  if (e == (ENGINE *)0x0) {
    e = ENGINE_by_id("dynamic");
    if (e != (ENGINE *)0x0) {
      iVar3 = ENGINE_ctrl_cmd_string(e,"SO_PATH","qatengine",0);
      if ((iVar3 != 0) && (iVar3 = ENGINE_ctrl_cmd_string(e,"LOAD",(char *)0x0,0), iVar3 != 0))
      goto LAB_001355c7;
      ENGINE_free(e);
    }
    note("%s not found","qatengine");
  }
  else {
LAB_001355c7:
    ENGINE_set_default_RSA(e);
    EVP_PKEY_free((EVP_PKEY *)local_480.key);
    setup_sign_certificate(&local_480);
    enter_subtest("many-handshakes-qatengine");
    many_handshakes();
    exit_subtest("many-handshakes-qatengine");
  }
  iVar3 = done_testing();
  OSSL_PROVIDER_unload(uVar5);
  OSSL_PROVIDER_unload(uVar4);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    ptls_openssl_sign_certificate_t openssl_sign_certificate;
    ptls_openssl_verify_certificate_t openssl_verify_certificate;
    ptls_ech_create_opener_t ech_create_opener = {.cb = create_ech_opener};

    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();

#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    /* Explicitly load the legacy provider in addition to default, as we test Blowfish in one of the tests. */
    OSSL_PROVIDER *legacy = OSSL_PROVIDER_load(NULL, "legacy");
    OSSL_PROVIDER *dflt = OSSL_PROVIDER_load(NULL, "default");
#elif !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    subtest("bf", test_bf);

    subtest("key-exchange", test_key_exchanges);

    ptls_iovec_t cert;
    setup_certificate(&cert);
    setup_sign_certificate(&openssl_sign_certificate);
    X509_STORE *cert_store = X509_STORE_new();
    X509_STORE_set_verify_cb(cert_store, verify_cert_cb);
    ptls_openssl_init_verify_certificate(&openssl_verify_certificate, cert_store);
    /* we should call X509_STORE_free on OpenSSL 1.1 or in prior versions decrement refount then call _free */
    ptls_context_t openssl_ctx = {.random_bytes = ptls_openssl_random_bytes,
                                  .get_time = &ptls_get_time,
                                  .key_exchanges = ptls_openssl_key_exchanges,
                                  .cipher_suites = ptls_openssl_cipher_suites_all,
                                  .tls12_cipher_suites = ptls_openssl_tls12_cipher_suites,
                                  .certificates = {&cert, 1},
                                  .ech = {.client = {.ciphers = ptls_openssl_hpke_cipher_suites, .kems = ptls_openssl_hpke_kems},
                                          .server = {.create_opener = &ech_create_opener,
                                                     .retry_configs = {(uint8_t *)ECH_CONFIG_LIST, sizeof(ECH_CONFIG_LIST) - 1}}},
                                  .sign_certificate = &openssl_sign_certificate.super};
    ptls_context_t openssl_ctx_sha256only = openssl_ctx;
    while (openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size != 32) {
        assert(openssl_ctx.cipher_suites[0]->hash->digest_size == 64 || /* sha512 */
               openssl_ctx.cipher_suites[0]->hash->digest_size == 48);  /* sha384 */
        ++openssl_ctx_sha256only.cipher_suites;
    }
    assert(openssl_ctx_sha256only.cipher_suites[0]->hash->digest_size == 32); /* sha256 */

    ctx = ctx_peer = &openssl_ctx;
    verify_certificate = &openssl_verify_certificate.super;
    ADD_FFX_AES128_ALGORITHMS(openssl);
#if PTLS_OPENSSL_HAVE_CHACHA20_POLY1305
    ADD_FFX_CHACHA20_ALGORITHMS(openssl);
#endif

    subtest("sha", test_sha);
    subtest("rsa-sign", test_rsa_sign);
    subtest("ecdsa-sign", test_ecdsa_sign);
    subtest("ed25519-sign", test_ed25519_sign);
    subtest("cert-verify", test_cert_verify);
    subtest("picotls", test_picotls);

    ctx = ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx_sha256only;
    ctx_peer = &openssl_ctx;
    subtest("picotls", test_picotls);

    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx_sha256only;
    subtest("picotls", test_picotls);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t minicrypto_sign_certificate;
    ptls_iovec_t minicrypto_certificate = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(
        &minicrypto_sign_certificate, ptls_iovec_init(SECP256R1_PRIVATE_KEY, sizeof(SECP256R1_PRIVATE_KEY) - 1));
    ptls_context_t minicrypto_ctx = {.random_bytes = ptls_minicrypto_random_bytes,
                                     .get_time = &ptls_get_time,
                                     .key_exchanges = ptls_minicrypto_key_exchanges,
                                     .cipher_suites = ptls_minicrypto_cipher_suites,
                                     .certificates = {&minicrypto_certificate, 1},
                                     .sign_certificate = &minicrypto_sign_certificate.super};
    ctx = &openssl_ctx;
    ctx_peer = &minicrypto_ctx;
    subtest("vs. minicrypto", test_picotls);

    ctx = &minicrypto_ctx;
    ctx_peer = &openssl_ctx;
    subtest("minicrypto vs.", test_picotls);

    subtest("hpke", test_all_hpke);

#if ASYNC_TESTS
    // switch to x25519 / aes128gcmsha256 as we run benchmarks
    static ptls_key_exchange_algorithm_t *fast_keyex[] = {&ptls_openssl_x25519, NULL}; // use x25519 for speed
    static ptls_cipher_suite_t *fast_cipher[] = {&ptls_openssl_aes128gcmsha256, NULL};
    openssl_ctx.key_exchanges = fast_keyex;
    openssl_ctx.cipher_suites = fast_cipher;
    ctx = &openssl_ctx;
    ctx_peer = &openssl_ctx;
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-non-async", many_handshakes);
    openssl_sign_certificate.async = 0;
    subtest("many-handshakes-async", many_handshakes);
    { /* qatengine should be tested at last, because we do not have the code to unload or un-default it */
        const char *engine_name = "qatengine";
        ENGINE *qatengine;
        if ((qatengine = ENGINE_by_id(engine_name)) != NULL || (qatengine = load_engine(engine_name)) != NULL) {
            ENGINE_set_default_RSA(qatengine);
            ptls_openssl_dispose_sign_certificate(&openssl_sign_certificate); // reload cert to use qatengine
            setup_sign_certificate(&openssl_sign_certificate);
            subtest("many-handshakes-qatengine", many_handshakes);
        } else {
            note("%s not found", engine_name);
        }
    }
#endif

    int ret = done_testing();
#if !defined(LIBRESSL_VERSION_NUMBER) && OPENSSL_VERSION_NUMBER >= 0x30000000L
    OSSL_PROVIDER_unload(dflt);
    OSSL_PROVIDER_unload(legacy);
#endif
    return ret;
}